

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool ON_Font::TestInstalledFontList(ON_TextLog *text_log)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ON_SimpleArray<const_ON_Font_*> *pOVar5;
  ON_SHA1_Hash *pOVar6;
  ON_Font *pOVar7;
  ON_ClassArray<ON_FontFaceQuartet> *pOVar8;
  wchar_t *pwVar9;
  ON_Font *pOVar10;
  ulong uVar11;
  wchar_t *pwVar12;
  ON_FontFaceQuartet *src;
  char *format;
  uint i;
  ulong uVar13;
  long lVar14;
  ON_wString *s;
  bool bVar15;
  int local_16c;
  ON_wString qname1;
  ON_wString qname;
  ON_TextLogIndent indent2;
  ON_wString local_118 [5];
  ulong local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  ON_TextLogIndent indent1;
  ON_TextLogIndent indent1_1;
  ON_wString local_58 [5];
  
  ON_ManagedFonts::InstalledFonts();
  iVar1 = ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count;
  uVar11 = (ulong)(uint)ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count;
  if (uVar11 == 0) {
    format = "ERROR: 0 = ON_Font::InstalledFontList().Count()\n";
  }
  else {
    pOVar5 = ON_FontList::ByFontCharacteristicsHash(&ON_ManagedFonts::List.m_installed_fonts);
    if (iVar1 == pOVar5->m_count) {
      ON_TextLog::Print(text_log,"Testing %u installed fonts:\n",(ulong)(uint)iVar1);
      ON_TextLogIndent::ON_TextLogIndent(&indent1,text_log);
      ON_TextLog::Print(text_log,L"FromFontCharacteristicsHash() tests ...");
      ON_TextLogIndent::ON_TextLogIndent(&indent2,text_log);
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        pOVar6 = FontCharacteristicsHash(pOVar5->m_a[uVar13]);
        local_a8 = *(undefined8 *)pOVar6->m_digest;
        uStack_a0 = *(undefined8 *)(pOVar6->m_digest + 8);
        local_98 = *(undefined4 *)(pOVar6->m_digest + 0x10);
        ON_FontList::FromFontCharacteristicsHash
                  (&ON_ManagedFonts::List.m_installed_fonts,(ON_SHA1_Hash)*&pOVar6->m_digest,false);
      }
      ON_TextLog::Print(text_log," passed.\n");
      ON_TextLogIndent::~ON_TextLogIndent(&indent2);
      pOVar6 = FontCharacteristicsHash(&Default);
      local_b8 = *(undefined4 *)(pOVar6->m_digest + 0x10);
      local_c8 = *(undefined8 *)pOVar6->m_digest;
      uStack_c0 = *(undefined8 *)(pOVar6->m_digest + 8);
      pOVar7 = ON_FontList::FromFontCharacteristicsHash
                         (&ON_ManagedFonts::List.m_installed_fonts,(ON_SHA1_Hash)*&pOVar6->m_digest,
                          false);
      bVar15 = pOVar7 != (ON_Font *)0x0;
      if (!bVar15) {
        ON_TextLog::Print(text_log,
                          "ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n"
                         );
      }
      ON_TextLogIndent::~ON_TextLogIndent(&indent1);
      pOVar8 = ON_FontList::QuartetList(&ON_ManagedFonts::List.m_installed_fonts);
      local_f0 = (ulong)(uint)pOVar8->m_count;
      ON_TextLog::Print(text_log,"Testing %u quartets:\n");
      ON_TextLogIndent::ON_TextLogIndent(&indent1_1,text_log);
      local_16c = 0;
      for (uVar11 = 0; uVar11 != local_f0; uVar11 = uVar11 + 1) {
        src = pOVar8->m_a + uVar11;
        ON_wString::ON_wString(&qname,&src->m_quartet_name);
        bVar2 = ON_wString::IsEmpty(&qname);
        if (bVar2) {
          ON_TextLog::Print(text_log,"ERROR: nullptr = quartet_list[%u].QuartetName() is empty\n",
                            uVar11);
          local_16c = local_16c + 1;
          bVar15 = false;
        }
        else {
          pwVar9 = ON_wString::operator_cast_to_wchar_t_(&qname);
          ON_FontList::QuartetFromQuartetName
                    ((ON_FontFaceQuartet *)&indent1,&ON_ManagedFonts::List.m_installed_fonts,pwVar9)
          ;
          ON_wString::ON_wString((ON_wString *)&indent2,&src->m_quartet_name);
          ON_wString::ON_wString(local_58,(ON_wString *)&indent1);
          bVar2 = ::operator==((ON_wString *)&indent2,local_58);
          ON_wString::~ON_wString(local_58);
          ON_wString::~ON_wString((ON_wString *)&indent2);
          indent2.m_text_log = (ON_TextLog *)src->m_regular;
          indent2._8_8_ = src->m_bold;
          local_58[0].m_s = (wchar_t *)indent1._8_8_;
          ON_wString::ON_wString(local_118,L"regular");
          ON_wString::ON_wString(local_118 + 1,L"bold");
          ON_wString::ON_wString(local_118 + 2,L"italic");
          ON_wString::ON_wString(local_118 + 3,L"bolditalic");
          s = local_118;
          for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
            pOVar7 = (ON_Font *)(&indent2.m_text_log)[lVar14];
            if ((bVar2 != false) && (pOVar7 != (ON_Font *)local_58[lVar14].m_s)) {
              bVar2 = false;
            }
            if (pOVar7 != (ON_Font *)0x0) {
              ON_wString::ON_wString(&qname1,&qname);
              ON_wString::operator+=(&qname1,L" (");
              ON_wString::operator+=(&qname1,s);
              ON_wString::operator+=(&qname1,L")");
              pOVar6 = FontCharacteristicsHash(pOVar7);
              local_e8 = *(undefined8 *)pOVar6->m_digest;
              uStack_e0 = *(undefined8 *)(pOVar6->m_digest + 8);
              local_d8 = *(undefined4 *)(pOVar6->m_digest + 0x10);
              pOVar10 = ON_FontList::FromFontCharacteristicsHash
                                  (&ON_ManagedFonts::List.m_installed_fonts,
                                   (ON_SHA1_Hash)*&pOVar6->m_digest,false);
              if (pOVar10 != pOVar7) {
                pwVar9 = ON_wString::Array(&qname1);
                bVar15 = false;
                ON_TextLog::Print(text_log,
                                  "ERROR: nullptr = ON_Font::InstalledFontList().FromFontCharacteristicsHash(%ls,false).\n"
                                  ,pwVar9);
                local_16c = local_16c + 1;
              }
              bVar3 = IsBoldInQuartet(pOVar7);
              bVar4 = IsItalicInQuartet(pOVar7);
              if ((bool)(&DAT_006b3134)[lVar14] != bVar3) {
                pwVar9 = ON_wString::Array(&qname1);
                pwVar12 = L"false";
                if (bVar3) {
                  pwVar12 = L"true";
                }
                bVar15 = false;
                ON_TextLog::Print(text_log,"ERROR: IsBoldInQuartet(%ls) = %ls.\n",pwVar9,pwVar12);
                local_16c = local_16c + 1;
              }
              if ((bool)(&DAT_006b3138)[lVar14] != bVar4) {
                pwVar9 = ON_wString::Array(&qname1);
                pwVar12 = L"false";
                if (bVar4) {
                  pwVar12 = L"true";
                }
                bVar15 = false;
                ON_TextLog::Print(text_log,"ERROR: IsItalicInQuartet(%ls) = %ls.\n",pwVar9,pwVar12);
                local_16c = local_16c + 1;
              }
              ON_wString::~ON_wString(&qname1);
            }
            s = s + 1;
          }
          if (bVar2 == false) {
            pwVar9 = ON_wString::operator_cast_to_wchar_t_(&qname);
            ON_TextLog::Print(text_log,L"ERROR: QuartetFromQuartetName(%ls) failed.\n",pwVar9);
            local_16c = local_16c + 1;
          }
          lVar14 = 0x18;
          do {
            ON_wString::~ON_wString((ON_wString *)((long)&local_118[0].m_s + lVar14));
            lVar14 = lVar14 + -8;
          } while (lVar14 != -8);
          ON_wString::~ON_wString((ON_wString *)&indent1);
        }
        ON_wString::~ON_wString(&qname);
      }
      if (local_16c == 0) {
        ON_TextLog::Print(text_log,"Passed.\n");
      }
      else {
        ON_TextLog::Print(text_log,"FAILED. %u quartet errors.\n");
      }
      ON_TextLogIndent::~ON_TextLogIndent(&indent1_1);
      return bVar15;
    }
    format = 
    "ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n"
    ;
  }
  ON_TextLog::Print(text_log,format);
  return false;
}

Assistant:

bool ON_Font::TestInstalledFontList(ON_TextLog& text_log)
{
  const class ON_FontList& font_list = ON_Font::InstalledFontList();
  const unsigned font_count = font_list.Count();
  if (font_count <= 0)
  {
    text_log.Print("ERROR: 0 = ON_Font::InstalledFontList().Count()\n");
    return Internal_TestInstalledFontsFailure();
  }

  const ON_SimpleArray< const class ON_Font* >& by_hash = font_list.ByFontCharacteristicsHash();
  if (font_count != by_hash.UnsignedCount())
  {
    text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n");
    return Internal_TestInstalledFontsFailure();
  }

  const bool bReturnFirst = false;
  bool bPassedTest = true;

  text_log.Print("Testing %u installed fonts:\n", font_count);
  {
    const ON_TextLogIndent indent1(text_log);


    text_log.Print(L"FromFontCharacteristicsHash() tests ...");
    {
      ON_TextLogIndent indent2(text_log);
      unsigned error_count = 0;
      for (unsigned i = 0; i < font_count; ++i)
      {
        const ON_Font* f = by_hash[i];
        const ON_SHA1_Hash h = f->FontCharacteristicsHash();

        const ON_Font* f1 = f = font_list.FromFontCharacteristicsHash(h, bReturnFirst);
        if (f != f1)
        {
          if (0 == error_count)
            text_log.PrintNewLine();
          ++error_count;
          text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList().FromFontCharacteristicsHash(by_hash[%u],false).\n", i);
          bPassedTest = false;
        }
      }
      if (error_count > 0)
        text_log.Print("FAILED. %u errors.\n", error_count);
      else
        text_log.Print(" passed.\n");
    }

    {
      const ON_Font* f = font_list.FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(), bReturnFirst);
      if (nullptr == f)
      {
        text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList()..FromFontCharacteristicsHash(ON_Font::Default.FontCharacteristicsHash(),false)\n");
        bPassedTest = false;
      }
    }
  }

  const ON_ClassArray< ON_FontFaceQuartet >& quartet_list = font_list.QuartetList();
  const unsigned quartet_count = quartet_list.UnsignedCount();
  text_log.Print("Testing %u quartets:\n", quartet_count);
  {
    const ON_TextLogIndent indent1(text_log);

    unsigned error_count = 0;
    for (unsigned i = 0; i < quartet_count; ++i)
    {
      const ON_FontFaceQuartet& q = quartet_list[i];
      const ON_wString qname = q.QuartetName();
      if (qname.IsEmpty())
      {
        ++error_count;
        text_log.Print("ERROR: nullptr = quartet_list[%u].QuartetName() is empty\n", i);
        bPassedTest = false;
        continue;
      }
      const ON_FontFaceQuartet q1 = font_list.QuartetFromQuartetName(qname);
      bool bQuartetFromQuartetNamePass = q.QuartetName() == q1.QuartetName();
      const ON_Font* f[4] = { q.RegularFace(),q.BoldFace(),q.ItalicFace(),q.BoldItalicFace() };
      const ON_Font* f1[4] = { q1.RegularFace(),q1.BoldFace(),q1.ItalicFace(),q1.BoldItalicFace() };
      const bool bExpectedIsBoldInQuartet[4] = { false,true,false,true };
      const bool bExpectedIsItalicInQuartet[4] = { false,false,true,true };
      const ON_wString qface[4] = { ON_wString(L"regular"), ON_wString(L"bold"), ON_wString(L"italic"), ON_wString(L"bolditalic") };
      for (unsigned k = 0; k < 4; ++k)
      {
        if (bQuartetFromQuartetNamePass && f[k] != f1[k])
          bQuartetFromQuartetNamePass = false;
        if (nullptr != f[k])
        {
          ON_wString qname1 = qname;
          qname1 += L" (";
          qname1 += qface[k];
          qname1 += L")";
          const ON_SHA1_Hash h = f[k]->FontCharacteristicsHash();
          const ON_Font* f2 = font_list.FromFontCharacteristicsHash(h, bReturnFirst);
          if (f2 != f[k])
          {
            ++error_count;
            text_log.Print("ERROR: nullptr = ON_Font::InstalledFontList().FromFontCharacteristicsHash(%ls,false).\n", qname1.Array());
            bPassedTest = false;
          }
          const bool bIsBoldInQuartet = f[k]->IsBoldInQuartet();
          const bool bIsItalicInQuartet = f[k]->IsItalicInQuartet();
          if (bIsBoldInQuartet != bExpectedIsBoldInQuartet[k])
          {
            ++error_count;
            text_log.Print("ERROR: IsBoldInQuartet(%ls) = %ls.\n", qname1.Array(), bIsBoldInQuartet?L"true":L"false");
            bPassedTest = false;
          }
          if (bIsItalicInQuartet != bExpectedIsItalicInQuartet[k])
          {
            ++error_count;
            text_log.Print("ERROR: IsItalicInQuartet(%ls) = %ls.\n", qname1.Array(), bIsItalicInQuartet ? L"true" : L"false");
            bPassedTest = false;
          }
        }
      }
      if (false == bQuartetFromQuartetNamePass)
      {
        ++error_count;
        text_log.Print(L"ERROR: QuartetFromQuartetName(%ls) failed.\n",static_cast<const wchar_t*>(qname));
      }
    }
    if (error_count > 0)
      text_log.Print("FAILED. %u quartet errors.\n", error_count);
    else
      text_log.Print("Passed.\n");
  }

  return bPassedTest;
}